

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

coop_repository_stats_t * __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::query_stats
          (coop_repository_stats_t *__return_storage_ptr__,coop_repo_t *this)

{
  int iVar1;
  undefined4 extraout_var;
  coop_repository_stats_t basis_stats;
  coop_repository_stats_t local_48;
  
  iVar1 = (*(((this->m_final_dereg_chain).m_obj)->super_abstract_message_box_t).
            _vptr_abstract_message_box_t[0xe])();
  so_5::impl::coop_repository_basis_t::query_stats(&local_48,&this->super_coop_repository_basis_t);
  __return_storage_ptr__->m_registered_coop_count = local_48.m_registered_coop_count;
  __return_storage_ptr__->m_deregistered_coop_count = local_48.m_deregistered_coop_count;
  __return_storage_ptr__->m_total_agent_count = local_48.m_total_agent_count;
  __return_storage_ptr__->m_final_dereg_coop_count = CONCAT44(extraout_var,iVar1);
  return __return_storage_ptr__;
}

Assistant:

environment_infrastructure_t::coop_repository_stats_t
coop_repo_t::query_stats()
{
	const auto final_dereg_coops = m_final_dereg_chain->size();

	const auto basis_stats = coop_repository_basis_t::query_stats();

	return {
			basis_stats.m_registered_coop_count,
			basis_stats.m_deregistered_coop_count,
			basis_stats.m_total_agent_count,
			final_dereg_coops
		};
}